

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O3

void start_corpse_timeout(obj *body)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  short func_index;
  int n;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if ((body->corpsenm == 0xa3) || (body->corpsenm == 0x154)) {
    return;
  }
  lVar7 = 0x19;
  if (in_mklev == '\0') {
    lVar7 = 10;
  }
  uVar2 = moves - body->age;
  lVar8 = 0xfa - (ulong)uVar2;
  if (0xfa < uVar2) {
    lVar8 = lVar7;
  }
  uVar2 = mt_random();
  uVar6 = 1;
  do {
    uVar3 = mt_random();
    if (1 < uVar3 % 6) goto LAB_001e29db;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 10);
  uVar6 = 10;
LAB_001e29db:
  uVar9 = (ulong)uVar6 * (ulong)(uVar2 % 1000 + 1000);
  uVar2 = mt_random();
  if ((uVar2 & 1) == 0) {
    iVar4 = (int)((ulong)(lVar7 * 1000) / uVar9);
  }
  else {
    iVar4 = (int)((uVar9 * lVar7) / 1000);
  }
  iVar1 = body->corpsenm;
  lVar5 = (long)iVar1;
  if (iVar1 - 0x144U < 3) {
    lVar8 = 0xc;
    func_index = 2;
    do {
      uVar2 = mt_random();
      if (uVar2 * -0x55555555 < 0x55555556) goto LAB_001e2a6c;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 500);
    lVar8 = 500;
    goto LAB_001e2a6c;
  }
  lVar8 = lVar8 + (iVar4 - (int)lVar7);
  func_index = 1;
  if ((body->field_0x4b & 0xc) != 0) goto LAB_001e2a6c;
  if ((iVar1 - 0xfdU < 2) || (mons[lVar5].mlet != '4')) {
LAB_001e2ae3:
    if (mons[lVar5].mlet != '.') goto LAB_001e2a6c;
  }
  else if ((urole.malenum == 0x161) && (uVar2 = mt_random(), (uVar2 & 1) == 0)) {
    lVar5 = (long)body->corpsenm;
    goto LAB_001e2ae3;
  }
  if (((body->oxlth != 0) && ((*(uint *)&body->field_0x4a & 0x600000) == 0x200000)) &&
     ((body[1].age & 0x100) == 0)) {
    lVar7 = 2;
    do {
      uVar2 = mt_random();
      if (uVar2 * -0x6eb3e453 < 0x6eb3e46) {
        func_index = 2;
        lVar8 = lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x33);
  }
LAB_001e2a6c:
  if ((*(uint *)&body->field_0x4a & 0xc00) != 0) {
    *(uint *)&body->field_0x4a = *(uint *)&body->field_0x4a & 0xfffff3ff;
  }
  start_timer(body->olev,lVar8,2,func_index,body);
  return;
}

Assistant:

void start_corpse_timeout(struct obj *body)
{
	long when; 		/* rot away when this old */
	long corpse_age;	/* age of corpse          */
	int rot_adjust;
	short action;

#define TAINT_AGE (50L)		/* age when corpses go bad */
#define REVIVE_CHANCE 37	/* 1/37 chance for 50 turns ~ 75% chance */
#define ROT_AGE (250L)		/* age when corpses rot away */

	/* lizards and lichen don't rot or revive */
	if (body->corpsenm == PM_LIZARD || body->corpsenm == PM_LICHEN) return;

	action = ROT_CORPSE;		/* default action: rot away */
	rot_adjust = in_mklev ? 25 : 10;	/* give some variation */
	corpse_age = moves - body->age;
	if (corpse_age > ROT_AGE)
		when = rot_adjust;
	else
		when = ROT_AGE - corpse_age;
	when += (long)(rnz(rot_adjust) - rot_adjust);

	if (is_rider(&mons[body->corpsenm])) {
		/*
		 * Riders always revive.  They have a 1/3 chance per turn
		 * of reviving after 12 turns.  Always revive by 500.
		 */
		action = REVIVE_MON;
		for (when = 12L; when < 500L; when++)
		    if (!rn2(3)) break;

	} else if (!body->norevive &&
		   ((is_zombie(&mons[body->corpsenm]) &&
		     /* Priests have a chance to put down zombies for good. */
		     !(Role_if(PM_PRIEST) && !rn2(2))) ||
		    mons[body->corpsenm].mlet == S_TROLL)) {
		long age;
		struct monst *mtmp = get_mtraits(body, FALSE);
		if (mtmp && !mtmp->mcan) {
		    for (age = 2; age <= TAINT_AGE; age++) {
			if (!rn2(REVIVE_CHANCE)) {	/* monster revives */
			    action = REVIVE_MON;
			    when = age;
			    break;
			}
		    }
		}
	}

	if (body->norevive) body->norevive = 0;
	start_timer(body->olev, when, TIMER_OBJECT, action, body);
}